

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> * __thiscall
ELFIO::elfio::get_ordered_segments
          (vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *__return_storage_ptr__,
          elfio *this)

{
  size_t seg1;
  segment *psVar1;
  bool bVar2;
  Elf_Half EVar3;
  uint uVar4;
  int iVar5;
  segment *psVar6;
  reference ppsVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference __b;
  size_type sVar8;
  ulong local_c8;
  size_t i_1;
  segment *seg_1;
  size_t i;
  size_t nextSlot;
  reference local_a0;
  unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_> *seg;
  const_iterator __end2;
  const_iterator __begin2;
  Segments *__range2;
  undefined1 local_70 [8];
  deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> worklist;
  elfio *this_local;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *res;
  
  worklist.super__Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::vector(__return_storage_ptr__);
  std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::deque
            ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70);
  EVar3 = Segments::size(&this->segments);
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::reserve
            (__return_storage_ptr__,(ulong)EVar3);
  __end2 = Segments::begin(&this->segments);
  seg = (unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_> *)
        Segments::end(&this->segments);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_*,_std::vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>_>
                                     *)&seg), bVar2) {
    local_a0 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_*,_std::vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>_>
               ::operator*(&__end2);
    nextSlot = (size_t)std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>::get
                                 (local_a0);
    std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*>
              ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)local_70,
               (segment **)&nextSlot);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_*,_std::vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>_>
    ::operator++(&__end2);
  }
  i = 0;
  for (seg_1 = (segment *)0x0; psVar1 = seg_1,
      psVar6 = (segment *)
               std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::size
                         ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70),
      psVar1 < psVar6; seg_1 = (segment *)((long)&seg_1->_vptr_segment + 1)) {
    if (seg_1 != (segment *)i) {
      ppsVar7 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator[]
                          ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70,
                           (size_type)seg_1);
      uVar4 = (*(*ppsVar7)->_vptr_segment[0x18])();
      if ((uVar4 & 1) != 0) {
        ppsVar7 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator[]
                            ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70,
                             (size_type)seg_1);
        iVar5 = (*(*ppsVar7)->_vptr_segment[0x11])();
        if (CONCAT44(extraout_var,iVar5) == 0) {
          ppsVar7 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator[]
                              ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
                               local_70,i);
          iVar5 = (*(*ppsVar7)->_vptr_segment[0x11])();
          if (CONCAT44(extraout_var_00,iVar5) == 0) {
            i = i + 1;
          }
          ppsVar7 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator[]
                              ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
                               local_70,(size_type)seg_1);
          __b = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator[]
                          ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70,i)
          ;
          std::swap<ELFIO::segment*>(ppsVar7,__b);
          i = i + 1;
        }
      }
    }
  }
  do {
    bVar2 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::empty
                      ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      worklist.super__Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
      std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~deque
                ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70);
      if ((worklist.super__Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node._7_1_ & 1) == 0) {
        std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~vector
                  (__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppsVar7 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::front
                        ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70);
    i_1 = (size_t)*ppsVar7;
    std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::pop_front
              ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70);
    for (local_c8 = 0;
        sVar8 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::size
                          ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70),
        seg1 = i_1, local_c8 < sVar8; local_c8 = local_c8 + 1) {
      ppsVar7 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::operator[]
                          ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70,
                           local_c8);
      bVar2 = is_subsequence_of((segment *)seg1,*ppsVar7);
      if (bVar2) break;
    }
    sVar8 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::size
                      ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)local_70);
    if (local_c8 < sVar8) {
      std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*&>
                ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)local_70,(segment **)&i_1
                );
    }
    else {
      std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*&>
                ((vector<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)__return_storage_ptr__,
                 (segment **)&i_1);
    }
  } while( true );
}

Assistant:

std::vector<segment*> get_ordered_segments() const
    {
        std::vector<segment*> res;
        std::deque<segment*>  worklist;

        res.reserve( segments.size() );
        for ( const auto& seg : segments ) {
            worklist.emplace_back( seg.get() );
        }

        // Bring the segments which start at address 0 to the front
        size_t nextSlot = 0;
        for ( size_t i = 0; i < worklist.size(); ++i ) {
            if ( i != nextSlot && worklist[i]->is_offset_initialized() &&
                 worklist[i]->get_offset() == 0 ) {
                if ( worklist[nextSlot]->get_offset() == 0 ) {
                    ++nextSlot;
                }
                std::swap( worklist[i], worklist[nextSlot] );
                ++nextSlot;
            }
        }

        while ( !worklist.empty() ) {
            segment* seg = worklist.front();
            worklist.pop_front();

            size_t i = 0;
            for ( ; i < worklist.size(); ++i ) {
                if ( is_subsequence_of( seg, worklist[i] ) ) {
                    break;
                }
            }

            if ( i < worklist.size() ) {
                worklist.emplace_back( seg );
            }
            else {
                res.emplace_back( seg );
            }
        }

        return res;
    }